

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O1

void __thiscall
lsim::ModelWire::remove_segment_from_junction
          (ModelWire *this,ModelWireJunction *junction,ModelWireSegment *segment)

{
  ModelWireSegment *local_18;
  
  if (junction == (ModelWireJunction *)0x0) {
    __assert_fail("junction",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_wire.cpp"
                  ,0x118,
                  "void lsim::ModelWire::remove_segment_from_junction(ModelWireJunction *, ModelWireSegment *)"
                 );
  }
  if (segment != (ModelWireSegment *)0x0) {
    local_18 = segment;
    remove<lsim::ModelWireSegment*>(&junction->m_segments,&local_18);
    if ((junction->m_segments).
        super__Vector_base<lsim::ModelWireSegment_*,_std::allocator<lsim::ModelWireSegment_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (junction->m_segments).
        super__Vector_base<lsim::ModelWireSegment_*,_std::allocator<lsim::ModelWireSegment_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      remove_owner<lsim::ModelWireJunction>(&this->m_junctions,junction);
    }
    return;
  }
  __assert_fail("segment",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_wire.cpp"
                ,0x119,
                "void lsim::ModelWire::remove_segment_from_junction(ModelWireJunction *, ModelWireSegment *)"
               );
}

Assistant:

void ModelWire::remove_segment_from_junction(ModelWireJunction *junction, ModelWireSegment *segment) {
    assert(junction);
    assert(segment);
    junction->remove_segment(segment);
    if (junction->num_segments() == 0) {
        remove_junction(junction);
    }
}